

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

Vec_Int_t * Abc_FrameDeriveStatusArray(Vec_Ptr_t *vCexes)

{
  size_t __size;
  uint uVar1;
  void **ppvVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  
  if (vCexes == (Vec_Ptr_t *)0x0) {
    pVVar3 = (Vec_Int_t *)0x0;
  }
  else {
    uVar1 = vCexes->nSize;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    uVar6 = 0x10;
    if (0xe < uVar1 - 1) {
      uVar6 = uVar1;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = uVar6;
    if (uVar6 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)malloc((long)(int)uVar6 << 2);
    }
    pVVar3->pArray = piVar4;
    if ((int)uVar6 < (int)uVar1) {
      __size = (long)(int)uVar1 * 4;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc(__size);
      }
      else {
        piVar4 = (int *)realloc(piVar4,__size);
      }
      pVVar3->pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar3->nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset(pVVar3->pArray,0xff,(ulong)uVar1 * 4);
    }
    pVVar3->nSize = uVar1;
    if (0 < vCexes->nSize) {
      ppvVar2 = vCexes->pArray;
      lVar5 = 0;
      do {
        if (ppvVar2[lVar5] != (void *)0x0) {
          if ((int)uVar1 <= lVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar3->pArray[lVar5] = 0;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < vCexes->nSize);
    }
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Abc_FrameDeriveStatusArray( Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vStatuses;
    Abc_Cex_t * pCex;
    int i;
    if ( vCexes == NULL )
        return NULL;
    vStatuses = Vec_IntAlloc( Vec_PtrSize(vCexes) );
    Vec_IntFill( vStatuses, Vec_PtrSize(vCexes), -1 ); // assume UNDEC
    Vec_PtrForEachEntry( Abc_Cex_t *, vCexes, pCex, i )
        if ( pCex != NULL )
            Vec_IntWriteEntry( vStatuses, i, 0 ); // set this output as SAT
    return vStatuses;    
}